

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcFaceSurface::~IfcFaceSurface(IfcFaceSurface *this)

{
  ~IfcFaceSurface((IfcFaceSurface *)&this[-1].super_IfcFace.field_0x50);
  return;
}

Assistant:

IfcFaceSurface() : Object("IfcFaceSurface") {}